

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O2

void * __thiscall LockedPool::alloc(LockedPool *this,size_t size)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&this->mutex);
  if (size - 0x40001 < 0xfffffffffffc0000) {
LAB_00b2407a:
    pvVar3 = (void *)0x0;
  }
  else {
    p_Var4 = (_List_node_base *)&this->arenas;
    do {
      p_Var4 = (((_List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var4 == (_List_node_base *)&this->arenas) {
        bVar2 = new_arena(this,0x40000,0x10);
        if (!bVar2) goto LAB_00b2407a;
        pvVar3 = Arena::alloc((Arena *)((this->arenas).
                                        super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev + 1),size);
        break;
      }
      pvVar3 = Arena::alloc((Arena *)(p_Var4 + 1),size);
    } while (pvVar3 == (void *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return pvVar3;
}

Assistant:

void* LockedPool::alloc(size_t size)
{
    std::lock_guard<std::mutex> lock(mutex);

    // Don't handle impossible sizes
    if (size == 0 || size > ARENA_SIZE)
        return nullptr;

    // Try allocating from each current arena
    for (auto &arena: arenas) {
        void *addr = arena.alloc(size);
        if (addr) {
            return addr;
        }
    }
    // If that fails, create a new one
    if (new_arena(ARENA_SIZE, ARENA_ALIGN)) {
        return arenas.back().alloc(size);
    }
    return nullptr;
}